

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_reader.c
# Opt level: O1

void AddFormatsToMetaMetaInfo(SstStream Stream,_TimestepMetadataMsg *Msg)

{
  int iVar1;
  FFSFormatList pFVar2;
  size_t __size;
  size_t __size_00;
  _SstMetaMetaBlockInternal *p_Var3;
  char *__dest;
  char *__dest_00;
  
  for (pFVar2 = Msg->Formats; pFVar2 != (FFSFormatList)0x0; pFVar2 = pFVar2->Next) {
    p_Var3 = (_SstMetaMetaBlockInternal *)
             realloc(Stream->InternalMetaMetaInfo,(long)Stream->InternalMetaMetaCount * 0x28 + 0x28)
    ;
    Stream->InternalMetaMetaInfo = p_Var3;
    iVar1 = Stream->InternalMetaMetaCount;
    Stream->InternalMetaMetaCount = iVar1 + 1;
    p_Var3[iVar1].TimestepAdded = Msg->Timestep;
    __size = pFVar2->FormatIDRepLen;
    __dest = (char *)malloc(__size);
    p_Var3[iVar1].ID = __dest;
    p_Var3[iVar1].IDSize = __size;
    __size_00 = pFVar2->FormatServerRepLen;
    __dest_00 = (char *)malloc(__size_00);
    p_Var3[iVar1].BlockData = __dest_00;
    p_Var3[iVar1].BlockSize = __size_00;
    memcpy(__dest,pFVar2->FormatIDRep,__size);
    memcpy(__dest_00,pFVar2->FormatServerRep,pFVar2->FormatServerRepLen);
  }
  return;
}

Assistant:

void AddFormatsToMetaMetaInfo(SstStream Stream, struct _TimestepMetadataMsg *Msg)
{
    FFSFormatList Formats = Msg->Formats;
    STREAM_ASSERT_LOCKED(Stream);
    while (Formats)
    {
        Stream->InternalMetaMetaInfo =
            realloc(Stream->InternalMetaMetaInfo, (sizeof(struct _SstMetaMetaBlockInternal) *
                                                   (Stream->InternalMetaMetaCount + 1)));
        struct _SstMetaMetaBlockInternal *NewInfo =
            &Stream->InternalMetaMetaInfo[Stream->InternalMetaMetaCount];
        Stream->InternalMetaMetaCount++;
        NewInfo->TimestepAdded = Msg->Timestep;
        NewInfo->ID = malloc(Formats->FormatIDRepLen);
        NewInfo->IDSize = Formats->FormatIDRepLen;
        NewInfo->BlockData = malloc(Formats->FormatServerRepLen);
        NewInfo->BlockSize = Formats->FormatServerRepLen;
        memcpy(NewInfo->ID, Formats->FormatIDRep, Formats->FormatIDRepLen);
        memcpy(NewInfo->BlockData, Formats->FormatServerRep, Formats->FormatServerRepLen);
        Formats = Formats->Next;
    }
}